

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

void CopyState(pyhanabi_state_t *src,pyhanabi_state_t *dest)

{
  void *pvVar1;
  undefined8 *in_RSI;
  long *in_RDI;
  HanabiState *in_stack_00000008;
  HanabiState *in_stack_00000010;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("src != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,300,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
  }
  if (*in_RDI != 0) {
    if (in_RSI != (undefined8 *)0x0) {
      pvVar1 = operator_new(0xa0);
      hanabi_learning_env::HanabiState::HanabiState(in_stack_00000010,in_stack_00000008);
      *in_RSI = pvVar1;
      return;
    }
    __assert_fail("dest != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x12e,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
  }
  __assert_fail("src->state != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x12d,"void CopyState(const pyhanabi_state_t *, pyhanabi_state_t *)");
}

Assistant:

void CopyState(const pyhanabi_state_t* src, pyhanabi_state_t* dest) {
  REQUIRE(src != nullptr);
  REQUIRE(src->state != nullptr);
  REQUIRE(dest != nullptr);
  dest->state = new hanabi_learning_env::HanabiState(
      *static_cast<hanabi_learning_env::HanabiState*>(src->state));
}